

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall cmCTestTestHandler::UpdateForFixtures(cmCTestTestHandler *this,ListOfTests *tests)

{
  char **ppcVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  iterator iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  value_type *pvVar5;
  cmCTestTestHandler *pcVar6;
  bool bVar7;
  long *plVar8;
  _Rb_tree_node_base *p_Var9;
  vector<unsigned_long,std::allocator<unsigned_long>> *pvVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>
  _Var12;
  ostream *poVar13;
  _Base_ptr p_Var14;
  iterator iVar15;
  long *plVar16;
  size_type *psVar17;
  cmCTestTestProperties *p;
  pointer pcVar18;
  pointer pcVar19;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  *pvVar20;
  _Base_ptr p_Var21;
  iterator tIt;
  unsigned_long uVar22;
  FixtureDepsIterator sIt;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  pVar23;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar24;
  string cleanupRegExp;
  string setupRegExp;
  FixtureDependencies fixtureSetups;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fixtures;
  ostringstream cmCTestLog_msg;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  setupFixturesAdded;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  fixtureRequirements;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedTests;
  RegularExpression excludeSetupRegex;
  FixtureDependencies fixtureCleanups;
  RegularExpression excludeCleanupRegex;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedFixtures;
  unsigned_long local_528;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  *local_520;
  cmCTestTestHandler *local_518;
  long local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  long *local_4e8;
  long local_4d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [32];
  _Base_ptr local_488;
  size_t local_480;
  _Base_ptr local_478;
  _Rb_tree_node_base *local_470;
  char *local_468;
  _Rb_tree_node_base local_460;
  undefined1 local_438 [32];
  __normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>
  local_418;
  ios_base local_3c8 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_2c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_290;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  RegularExpression local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  local_160;
  RegularExpression local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_438,"Updating test list for fixtures",0x1f);
  std::ios::widen((char)(ostringstream *)local_438 + (char)*(undefined8 *)(local_438._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_438);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x3a8,local_230.startp[0],(this->super_cmCTestGenericHandler).Quiet);
  ppcVar1 = local_230.startp + 2;
  if ((char **)local_230.startp[0] != ppcVar1) {
    operator_delete(local_230.startp[0],(ulong)(local_230.startp[2] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  pcVar3 = (this->ExcludeFixtureRegExp)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c8,pcVar3,pcVar3 + (this->ExcludeFixtureRegExp)._M_string_length);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  pcVar3 = (this->ExcludeFixtureRegExp)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,pcVar3,pcVar3 + (this->ExcludeFixtureRegExp)._M_string_length);
  local_518 = this;
  if ((this->ExcludeFixtureSetupRegExp)._M_string_length != 0) {
    if (local_4c8._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_4c8);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                     "(",&local_4c8);
      plVar8 = (long *)std::__cxx11::string::append(local_4a8);
      plVar16 = plVar8 + 2;
      if ((char **)*plVar8 == (char **)plVar16) {
        local_130.startp[2] = (char *)*plVar16;
        local_130.startp[3] = (char *)plVar8[3];
        local_130.startp[0] = (char *)(local_130.startp + 2);
      }
      else {
        local_130.startp[2] = (char *)*plVar16;
        local_130.startp[0] = (char *)*plVar8;
      }
      local_130.startp[1] = (char *)plVar8[1];
      *plVar8 = (long)plVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,
                                  (ulong)(this->ExcludeFixtureSetupRegExp)._M_dataplus._M_p);
      plVar16 = plVar8 + 2;
      if ((char **)*plVar8 == (char **)plVar16) {
        local_230.startp[2] = (char *)*plVar16;
        local_230.startp[3] = (char *)plVar8[3];
        local_230.startp[0] = (char *)ppcVar1;
      }
      else {
        local_230.startp[2] = (char *)*plVar16;
        local_230.startp[0] = (char *)*plVar8;
      }
      local_230.startp[1] = (char *)plVar8[1];
      *plVar8 = (long)plVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar17 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar17) {
        local_438._16_8_ = *psVar17;
        local_438._24_8_ = plVar8[3];
        local_438._0_8_ = local_438 + 0x10;
      }
      else {
        local_438._16_8_ = *psVar17;
        local_438._0_8_ = (size_type *)*plVar8;
      }
      local_438._8_8_ = plVar8[1];
      *plVar8 = (long)psVar17;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_4c8,local_438._0_8_);
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      this = local_518;
      if ((char **)local_230.startp[0] != ppcVar1) {
        operator_delete(local_230.startp[0],(ulong)(local_230.startp[2] + 1));
      }
      if ((char **)local_130.startp[0] != local_130.startp + 2) {
        operator_delete(local_130.startp[0],(ulong)(local_130.startp[2] + 1));
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
      }
    }
  }
  if ((this->ExcludeFixtureCleanupRegExp)._M_string_length != 0) {
    if (local_508._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&local_508);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                     "(",&local_508);
      plVar8 = (long *)std::__cxx11::string::append(local_4a8);
      plVar16 = plVar8 + 2;
      if ((char **)*plVar8 == (char **)plVar16) {
        local_130.startp[2] = (char *)*plVar16;
        local_130.startp[3] = (char *)plVar8[3];
        local_130.startp[0] = (char *)(local_130.startp + 2);
      }
      else {
        local_130.startp[2] = (char *)*plVar16;
        local_130.startp[0] = (char *)*plVar8;
      }
      local_130.startp[1] = (char *)plVar8[1];
      *plVar8 = (long)plVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,
                                  (ulong)(this->ExcludeFixtureCleanupRegExp)._M_dataplus._M_p);
      plVar16 = plVar8 + 2;
      if ((char **)*plVar8 == (char **)plVar16) {
        local_230.startp[2] = (char *)*plVar16;
        local_230.startp[3] = (char *)plVar8[3];
        local_230.startp[0] = (char *)ppcVar1;
      }
      else {
        local_230.startp[2] = (char *)*plVar16;
        local_230.startp[0] = (char *)*plVar8;
      }
      local_230.startp[1] = (char *)plVar8[1];
      *plVar8 = (long)plVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar17 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar17) {
        local_438._16_8_ = *psVar17;
        local_438._24_8_ = plVar8[3];
        local_438._0_8_ = local_438 + 0x10;
      }
      else {
        local_438._16_8_ = *psVar17;
        local_438._0_8_ = (size_type *)*plVar8;
      }
      local_438._8_8_ = plVar8[1];
      *plVar8 = (long)psVar17;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_508,local_438._0_8_);
      if ((undefined1 *)local_438._0_8_ != local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      this = local_518;
      if ((char **)local_230.startp[0] != ppcVar1) {
        operator_delete(local_230.startp[0],(ulong)(local_230.startp[2] + 1));
      }
      if ((char **)local_130.startp[0] != local_130.startp + 2) {
        operator_delete(local_130.startp[0],(ulong)(local_130.startp[2] + 1));
      }
      if ((undefined1 *)local_4a8._0_8_ != local_4a8 + 0x10) {
        operator_delete((void *)local_4a8._0_8_,local_4a8._16_8_ + 1);
      }
    }
  }
  local_230.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_230,local_4c8._M_dataplus._M_p);
  local_130.program = (char *)0x0;
  local_520 = tests;
  cmsys::RegularExpression::compile(&local_130,local_508._M_dataplus._M_p);
  local_4a8._24_8_ = local_4a8 + 8;
  local_4a8._8_4_ = _S_red;
  local_4a8._16_8_ = 0;
  local_480 = 0;
  local_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_160._M_impl.super__Rb_tree_header._M_header;
  local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar19 = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_488 = (_Base_ptr)local_4a8._24_8_;
  local_160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_160._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar19 !=
      (this->TestList).
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = local_438 + 0x10;
    do {
      for (p_Var9 = (pcVar19->FixturesSetup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(pcVar19->FixturesSetup)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        local_438._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        local_418._M_current = pcVar19;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
        ::
        _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                    *)local_4a8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                    *)local_438);
        if ((pointer)local_438._0_8_ != pcVar3) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      for (p_Var9 = (pcVar19->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 !=
          &(pcVar19->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        local_438._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_438,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        local_418._M_current = pcVar19;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
        ::
        _M_emplace_equal<std::pair<std::__cxx11::string,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,__gnu_cxx::__normal_iterator<cmCTestTestHandler::cmCTestTestProperties_const*,std::vector<cmCTestTestHandler::cmCTestTestProperties,std::allocator<cmCTestTestHandler::cmCTestTestProperties>>>>>>
                    *)&local_160,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>
                    *)local_438);
        if ((pointer)local_438._0_8_ != pcVar3) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
      }
      pcVar19 = pcVar19 + 1;
    } while (pcVar19 !=
             (local_518->TestList).
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pvVar20 = local_520;
  local_260._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_260._M_impl.super__Rb_tree_header._M_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar18 = (local_520->
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar19 = pcVar18;
  local_260._M_impl.super__Rb_tree_header._M_header._M_right =
       local_260._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar18 !=
      (local_520->
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&local_260,&pcVar18->Name);
      pcVar18 = pcVar18 + 1;
    } while (pcVar18 !=
             (pvVar20->
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    pcVar19 = (pvVar20->
              super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_528 = 0;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pcVar18 != pcVar19) {
    local_510 = 0;
    do {
      if (pcVar19[local_528].Disabled == false) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_468,&pcVar19[local_528].FixturesRequired._M_t);
        for (p_Var14 = local_460._M_left; p_Var14 != &local_460;
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
          if (p_Var14[1]._M_parent != (_Base_ptr)0x0) {
            p_Var9 = p_Var14 + 1;
            pvVar10 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                    *)&local_290,(key_type *)p_Var9);
            iVar4._M_current = *(unsigned_long **)(pvVar10 + 8);
            if (iVar4._M_current == *(unsigned_long **)(pvVar10 + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(pvVar10,iVar4,&local_528);
            }
            else {
              *iVar4._M_current = local_528;
              *(unsigned_long **)(pvVar10 + 8) = iVar4._M_current + 1;
            }
            pVar23 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                     ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                                    *)local_4a8,(key_type *)p_Var9);
            for (_Var12 = pVar23.first._M_node; _Var12._M_node != pVar23.second._M_node._M_node;
                _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node)) {
              __v = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     (_Var12._M_node + 2);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(local_520->
                             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                             )._M_impl.super__Vector_impl_data._M_start[local_528].
                             RequireSuccessDepends,__v);
              pvVar20 = local_520;
              pcVar19 = (local_520->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              _Var11 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (pcVar19[local_528].Depends.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  *(pointer *)
                                   ((long)&pcVar19[local_528].Depends.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl + 8),__v);
              pcVar19 = (pvVar20->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if (_Var11._M_current ==
                  *(pointer *)
                   ((long)&pcVar19[local_528].Depends.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar19[local_528].Depends,__v);
              }
            }
            pVar24 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&local_60,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var9);
            pvVar20 = local_520;
            if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              if ((local_4c8._M_string_length == 0) ||
                 (bVar7 = cmsys::RegularExpression::find(&local_230,*(char **)p_Var9), !bVar7)) {
                pVar23 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                         ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                                        *)local_4a8,(key_type *)p_Var9);
                for (_Var12 = pVar23.first._M_node; _Var12._M_node != pVar23.second._M_node._M_node;
                    _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node)) {
                  pvVar5 = *(value_type **)(_Var12._M_node + 2);
                  pVar24 = std::
                           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           ::_M_insert_unique<std::__cxx11::string_const&>
                                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                       *)&local_260,&pvVar5->Name);
                  pvVar20 = local_520;
                  if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    std::
                    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ::push_back(local_520,pvVar5);
                    (pvVar20->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                         (int)((ulong)((long)pvVar5 -
                                      (long)(local_518->TestList).
                                            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         0x781948b1 + 1;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_438,"Added setup test ",0x11);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_438,(pvVar5->Name)._M_dataplus._M_p,
                                         (pvVar5->Name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13," required by fixture ",0x15);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar13,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent)
                    ;
                    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                    std::ostream::put((char)poVar13);
                    std::ostream::flush();
                    pcVar6 = local_518;
                    pcVar2 = (local_518->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                 ,0x43f,(char *)local_4e8,
                                 (pcVar6->super_cmCTestGenericHandler).Quiet);
                    if (local_4e8 != local_4d8) {
                      operator_delete(local_4e8,local_4d8[0] + 1);
                    }
                    local_510 = local_510 + 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                    std::ios_base::~ios_base(local_3c8);
                  }
                  pvVar20 = local_520;
                }
              }
              if ((local_508._M_string_length == 0) ||
                 (bVar7 = cmsys::RegularExpression::find(&local_130,*(char **)p_Var9), !bVar7)) {
                pVar23 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
                         ::equal_range(&local_160,(key_type *)p_Var9);
                for (_Var12 = pVar23.first._M_node; _Var12._M_node != pVar23.second._M_node._M_node;
                    _Var12._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var12._M_node)) {
                  pvVar5 = *(value_type **)(_Var12._M_node + 2);
                  pVar24 = std::
                           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           ::_M_insert_unique<std::__cxx11::string_const&>
                                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                       *)&local_260,&pvVar5->Name);
                  if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    std::
                    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ::push_back(pvVar20,pvVar5);
                    (pvVar20->
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    )._M_impl.super__Vector_impl_data._M_finish[-1].Index =
                         (int)((ulong)((long)pvVar5 -
                                      (long)(local_518->TestList).
                                            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         0x781948b1 + 1;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_438,"Added cleanup test ",0x13);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_438,(pvVar5->Name)._M_dataplus._M_p,
                                         (pvVar5->Name)._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar13," required by fixture ",0x15);
                    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar13,*(char **)(p_Var14 + 1),(long)p_Var14[1]._M_parent)
                    ;
                    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
                    std::ostream::put((char)poVar13);
                    std::ostream::flush();
                    pcVar6 = local_518;
                    pcVar2 = (local_518->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::stringbuf::str();
                    cmCTest::Log(pcVar2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                                 ,0x45f,(char *)local_4e8,
                                 (pcVar6->super_cmCTestGenericHandler).Quiet);
                    if (local_4e8 != local_4d8) {
                      operator_delete(local_4e8,local_4d8[0] + 1);
                    }
                    local_510 = local_510 + 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                    std::ios_base::~ios_base(local_3c8);
                  }
                }
              }
            }
          }
        }
        pcVar19 = (pvVar20->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        p_Var9 = *(_Base_ptr *)((long)&pcVar19[local_528].FixturesSetup._M_t._M_impl + 0x18);
        uVar22 = local_528;
        if (p_Var9 != (_Rb_tree_node_base *)
                      ((long)&pcVar19[local_528].FixturesSetup._M_t._M_impl + 8U)) {
          do {
            if (p_Var9[1]._M_parent != (_Base_ptr)0x0) {
              pvVar10 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                      *)&local_2c0,(key_type *)(p_Var9 + 1));
              iVar4._M_current = *(unsigned_long **)(pvVar10 + 8);
              if (iVar4._M_current == *(unsigned_long **)(pvVar10 + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(pvVar10,iVar4,&local_528);
                uVar22 = local_528;
              }
              else {
                *iVar4._M_current = local_528;
                *(unsigned_long **)(pvVar10 + 8) = iVar4._M_current + 1;
                uVar22 = local_528;
              }
            }
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != (_Rb_tree_node_base *)
                             ((long)&(pvVar20->
                                     super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar22].
                                     FixturesSetup._M_t._M_impl + 8U));
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_468);
        pcVar19 = (pvVar20->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pcVar18 = (pvVar20->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      local_528 = local_528 + 1;
    } while (local_528 < (ulong)(((long)pcVar18 - (long)pcVar19 >> 3) * 0x2c3f35ba781948b1));
    for (; pcVar19 != pcVar18; pcVar19 = pcVar19 + 1) {
      p_Var14 = (pcVar19->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_478 = &(pcVar19->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var14 != local_478) {
        do {
          local_470 = p_Var14;
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::find(&local_290,(key_type *)(p_Var14 + 1));
          if ((_Rb_tree_header *)iVar15._M_node != &local_290._M_impl.super__Rb_tree_header) {
            for (p_Var21 = *(_Base_ptr *)(iVar15._M_node + 2);
                p_Var21 != iVar15._M_node[2]._M_parent; p_Var21 = (_Base_ptr)&p_Var21->_M_parent) {
              pcVar18 = (local_520->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var21;
              _Var11 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pcVar19->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pcVar19->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,pcVar18);
              if (_Var11._M_current ==
                  (pcVar19->Depends).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar19->Depends,&pcVar18->Name);
              }
            }
          }
          iVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::find(&local_2c0,(key_type *)(p_Var14 + 1));
          pvVar20 = local_520;
          if ((_Rb_tree_header *)iVar15._M_node != &local_2c0._M_impl.super__Rb_tree_header) {
            for (p_Var14 = *(_Base_ptr *)(iVar15._M_node + 2);
                p_Var14 != iVar15._M_node[2]._M_parent; p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
              pcVar18 = (pvVar20->
                        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                        )._M_impl.super__Vector_impl_data._M_start + *(long *)p_Var14;
              _Var11 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pcVar19->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pcVar19->Depends).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,pcVar18);
              if (_Var11._M_current ==
                  (pcVar19->Depends).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&pcVar19->Depends,&pcVar18->Name);
              }
            }
          }
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(local_470);
        } while (p_Var14 != local_478);
        pcVar18 = (pvVar20->
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  pcVar6 = local_518;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"Added ",6);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_438);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar13," tests to meet fixture requirements",0x23);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  pcVar2 = (pcVar6->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x4a3,local_468,(pcVar6->super_cmCTestGenericHandler).Quiet);
  if ((_Base_ptr *)local_468 != &local_460._M_parent) {
    operator_delete(local_468,(ulong)((long)&(local_460._M_parent)->_M_color + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_2c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&local_290);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_260);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree(&local_160);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,___gnu_cxx::__normal_iterator<const_cmCTestTestHandler::cmCTestTestProperties_*,_std::vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>_>_>_>_>
               *)local_4a8);
  if (local_130.program != (char *)0x0) {
    operator_delete__(local_130.program);
  }
  if (local_230.program != (char *)0x0) {
    operator_delete__(local_230.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestTestHandler::UpdateForFixtures(ListOfTests& tests) const
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Updating test list for fixtures" << std::endl,
                     this->Quiet);

  // Prepare regular expression evaluators
  std::string setupRegExp(this->ExcludeFixtureRegExp);
  std::string cleanupRegExp(this->ExcludeFixtureRegExp);
  if (!this->ExcludeFixtureSetupRegExp.empty()) {
    if (setupRegExp.empty()) {
      setupRegExp = this->ExcludeFixtureSetupRegExp;
    } else {
      setupRegExp.append("(" + setupRegExp + ")|(" +
                         this->ExcludeFixtureSetupRegExp + ")");
    }
  }
  if (!this->ExcludeFixtureCleanupRegExp.empty()) {
    if (cleanupRegExp.empty()) {
      cleanupRegExp = this->ExcludeFixtureCleanupRegExp;
    } else {
      cleanupRegExp.append("(" + cleanupRegExp + ")|(" +
                           this->ExcludeFixtureCleanupRegExp + ")");
    }
  }
  cmsys::RegularExpression excludeSetupRegex(setupRegExp);
  cmsys::RegularExpression excludeCleanupRegex(cleanupRegExp);

  // Prepare some maps to help us find setup and cleanup tests for
  // any given fixture
  typedef ListOfTests::const_iterator TestIterator;
  typedef std::multimap<std::string, TestIterator> FixtureDependencies;
  typedef FixtureDependencies::const_iterator FixtureDepsIterator;
  FixtureDependencies fixtureSetups;
  FixtureDependencies fixtureCleanups;

  for (ListOfTests::const_iterator it = this->TestList.begin();
       it != this->TestList.end(); ++it) {
    const cmCTestTestProperties& p = *it;

    const std::set<std::string>& setups = p.FixturesSetup;
    for (std::set<std::string>::const_iterator depsIt = setups.begin();
         depsIt != setups.end(); ++depsIt) {
      fixtureSetups.insert(std::make_pair(*depsIt, it));
    }

    const std::set<std::string>& cleanups = p.FixturesCleanup;
    for (std::set<std::string>::const_iterator depsIt = cleanups.begin();
         depsIt != cleanups.end(); ++depsIt) {
      fixtureCleanups.insert(std::make_pair(*depsIt, it));
    }
  }

  // Prepare fast lookup of tests already included in our list of tests
  std::set<std::string> addedTests;
  for (ListOfTests::const_iterator it = tests.begin(); it != tests.end();
       ++it) {
    const cmCTestTestProperties& p = *it;
    addedTests.insert(p.Name);
  }

  // These are lookups of fixture name to a list of indices into the final
  // tests array for tests which require that fixture and tests which are
  // setups for that fixture. They are needed at the end to populate
  // dependencies of the cleanup tests in our final list of tests.
  std::map<std::string, std::vector<size_t> > fixtureRequirements;
  std::map<std::string, std::vector<size_t> > setupFixturesAdded;

  // Use integer index for iteration because we append to
  // the tests vector as we go
  size_t fixtureTestsAdded = 0;
  std::set<std::string> addedFixtures;
  for (size_t i = 0; i < tests.size(); ++i) {
    // Skip disabled tests
    if (tests[i].Disabled) {
      continue;
    }

    // There are two things to do for each test:
    //   1. For every fixture required by this test, record that fixture as
    //      being required and create dependencies on that fixture's setup
    //      tests.
    //   2. Record all setup tests in the final test list so we can later make
    //      cleanup tests in the test list depend on their associated setup
    //      tests to enforce correct ordering.

    // 1. Handle fixture requirements
    //
    // Must copy the set of fixtures required because we may invalidate
    // the tests array by appending to it
    std::set<std::string> fixtures = tests[i].FixturesRequired;
    for (std::set<std::string>::const_iterator fixturesIt = fixtures.begin();
         fixturesIt != fixtures.end(); ++fixturesIt) {

      const std::string& requiredFixtureName = *fixturesIt;
      if (requiredFixtureName.empty()) {
        continue;
      }

      fixtureRequirements[requiredFixtureName].push_back(i);

      // Add dependencies to this test for all of the setup tests
      // associated with the required fixture. If any of those setup
      // tests fail, this test should not run. We make the fixture's
      // cleanup tests depend on this test case later.
      std::pair<FixtureDepsIterator, FixtureDepsIterator> setupRange =
        fixtureSetups.equal_range(requiredFixtureName);
      for (FixtureDepsIterator sIt = setupRange.first;
           sIt != setupRange.second; ++sIt) {
        const std::string& setupTestName = sIt->second->Name;
        tests[i].RequireSuccessDepends.insert(setupTestName);
        if (std::find(tests[i].Depends.begin(), tests[i].Depends.end(),
                      setupTestName) == tests[i].Depends.end()) {
          tests[i].Depends.push_back(setupTestName);
        }
      }

      // Append any fixture setup/cleanup tests to our test list if they
      // are not already in it (they could have been in the original
      // set of tests passed to us at the outset or have already been
      // added from a previously checked test). A fixture isn't required
      // to have setup/cleanup tests.
      if (!addedFixtures.insert(requiredFixtureName).second) {
        // Already seen this fixture, no need to check it again
        continue;
      }

      // Only add setup tests if this fixture has not been excluded
      if (setupRegExp.empty() ||
          !excludeSetupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureSetups.equal_range(requiredFixtureName);
        for (FixtureDepsIterator it = fixtureRange.first;
             it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added setup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }

      // Only add cleanup tests if this fixture has not been excluded
      if (cleanupRegExp.empty() ||
          !excludeCleanupRegex.find(requiredFixtureName)) {
        std::pair<FixtureDepsIterator, FixtureDepsIterator> fixtureRange =
          fixtureCleanups.equal_range(requiredFixtureName);
        for (FixtureDepsIterator it = fixtureRange.first;
             it != fixtureRange.second; ++it) {
          ListOfTests::const_iterator lotIt = it->second;
          const cmCTestTestProperties& p = *lotIt;

          if (!addedTests.insert(p.Name).second) {
            // Already have p in our test list
            continue;
          }

          // This is a test not yet in our list, so add it and
          // update its index to reflect where it was in the original
          // full list of all tests (needed to track individual tests
          // across ctest runs for re-run failed, etc.)
          tests.push_back(p);
          tests.back().Index =
            1 + static_cast<int>(std::distance(this->TestList.begin(), lotIt));
          ++fixtureTestsAdded;

          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Added cleanup test "
                               << p.Name << " required by fixture "
                               << requiredFixtureName << std::endl,
                             this->Quiet);
        }
      }
    }

    // 2. Record all setup fixtures included in the final list of tests
    for (std::set<std::string>::const_iterator fixturesIt =
           tests[i].FixturesSetup.begin();
         fixturesIt != tests[i].FixturesSetup.end(); ++fixturesIt) {

      const std::string& setupFixtureName = *fixturesIt;
      if (setupFixtureName.empty()) {
        continue;
      }

      setupFixturesAdded[setupFixtureName].push_back(i);
    }
  }

  // Now that we have the final list of tests, we can update all cleanup
  // tests to depend on those tests which require that fixture and on any
  // setup tests for that fixture. The latter is required to handle the
  // pathological case where setup and cleanup tests are in the test set
  // but no other test has that fixture as a requirement.
  for (ListOfTests::iterator tIt = tests.begin(); tIt != tests.end(); ++tIt) {
    cmCTestTestProperties& p = *tIt;
    const std::set<std::string>& cleanups = p.FixturesCleanup;
    for (std::set<std::string>::const_iterator fIt = cleanups.begin();
         fIt != cleanups.end(); ++fIt) {
      const std::string& fixture = *fIt;

      // This cleanup test could be part of the original test list that was
      // passed in. It is then possible that no other test requires the
      // fIt fixture, so we have to check for this.
      std::map<std::string, std::vector<size_t> >::const_iterator cIt =
        fixtureRequirements.find(fixture);
      if (cIt != fixtureRequirements.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (std::vector<size_t>::const_iterator indexIt = indices.begin();
             indexIt != indices.end(); ++indexIt) {
          const std::string& reqTestName = tests[*indexIt].Name;
          if (std::find(p.Depends.begin(), p.Depends.end(), reqTestName) ==
              p.Depends.end()) {
            p.Depends.push_back(reqTestName);
          }
        }
      }

      // Ensure fixture cleanup tests always run after their setup tests, even
      // if no other test cases require the fixture
      cIt = setupFixturesAdded.find(fixture);
      if (cIt != setupFixturesAdded.end()) {
        const std::vector<size_t>& indices = cIt->second;
        for (std::vector<size_t>::const_iterator indexIt = indices.begin();
             indexIt != indices.end(); ++indexIt) {
          const std::string& setupTestName = tests[*indexIt].Name;
          if (std::find(p.Depends.begin(), p.Depends.end(), setupTestName) ==
              p.Depends.end()) {
            p.Depends.push_back(setupTestName);
          }
        }
      }
    }
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Added "
                       << fixtureTestsAdded
                       << " tests to meet fixture requirements" << std::endl,
                     this->Quiet);
}